

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen10TextureCalc::FillTexPlanar
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  GMM_GFX_SIZE_T GVar8;
  bool bVar9;
  sbyte sVar10;
  bool bVar11;
  int iVar12;
  GMM_PLATFORM_INFO *pGVar13;
  WA_TABLE *pWVar14;
  GMM_PLATFORM_INFO *pGVar15;
  GMM_GFX_SIZE_T GVar16;
  uint local_b8;
  int local_b4;
  uint32_t local_ac;
  uint32_t local_a8;
  uint32_t local_a4;
  uint32_t local_a0;
  uint local_9c;
  int64_t LargeSize;
  GMM_GFX_SIZE_T ElementSizeBytes;
  uint32_t TileHeight_1;
  uint32_t TileCols;
  uint32_t TileWidth;
  uint32_t TileHeight;
  uint32_t LShift;
  uint32_t YSizeForUVPurposesDimensionalAlignment;
  uint32_t YSizeForUVPurposes;
  uint32_t YVSizeRShift;
  uint32_t UVSize;
  uint32_t YSize;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS local_40;
  GMM_STATUS GStack_3c;
  bool UVPacked;
  GMM_STATUS Status;
  uint32_t AdjustedVHeight;
  uint32_t VHeight;
  uint32_t YHeight;
  uint32_t Height;
  uint32_t WidthBytesPhysical;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen10TextureCalc *this_local;
  
  bVar9 = false;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pTexInfo->TileMode = TILE_NONE;
    _Height = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar13 = GmmGetPlatformInfo((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.
                                 pGmmLibContext);
    YHeight = (int)pRestrictions_local->MinAllocationSize *
              pRestrictions_local->RenderPitchAlignment >> 3;
    Status = GMM_SUCCESS;
    AdjustedVHeight = pRestrictions_local->MinHeight;
    switch(pRestrictions_local->PitchAlignment) {
    case 0x13c:
    case 0x156:
    case 0x159:
    case 0x15b:
    case 0x168:
      Status = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      VHeight = Status * 3;
      pRestrictions_local[4].MinHeight = 3;
      AdjustedVHeight = Status;
      break;
    default:
      return GMM_ERROR;
    case 0x14f:
    case 0x150:
    case 0x174:
    case 0x175:
      sVar10 = 4;
      if (pRestrictions_local->PitchAlignment != 0x175) {
        sVar10 = 2;
      }
      iVar12 = 4;
      if (pRestrictions_local->PitchAlignment != 0x175) {
        iVar12 = 2;
      }
      iVar12 = (((YHeight + iVar12 + -1) - (YHeight + iVar12 + -1 & iVar12 - 1U)) *
                ((AdjustedVHeight + iVar12 + -1) - (AdjustedVHeight + iVar12 + -1 & iVar12 - 1U)) >>
               sVar10) * 2;
      if (YHeight == 0) {
        local_9c = YHeight * AdjustedVHeight + iVar12;
      }
      else {
        local_9c = (YHeight * AdjustedVHeight + iVar12 + (YHeight - 1)) / YHeight;
      }
      VHeight = local_9c;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffefffffffff;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffdfffffffff;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffbfffffffff;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffff7ffffffff;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffff7ffff | 0x80000;
      pRestrictions_local[4].MinHeight = 1;
      break;
    case 0x151:
    case 0x153:
    case 0x158:
    case 0x15a:
      Status = ((AdjustedVHeight + GMM_ERROR >> 1) + 0xf) -
               ((AdjustedVHeight + GMM_ERROR >> 1) + 0xf & 0xf);
      AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      VHeight = AdjustedVHeight + Status * 2;
      pRestrictions_local[4].MinHeight = 3;
      break;
    case 0x152:
    case 0x154:
      AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      Status = AdjustedVHeight + 1 >> 1;
      YHeight = (YHeight + 1) - (YHeight + 1 & 1);
      VHeight = AdjustedVHeight + Status;
      bVar9 = true;
      pRestrictions_local[4].MinHeight = 2;
      break;
    case 0x157:
      Status = ((AdjustedVHeight + GMM_OUT_OF_MEMORY >> 2) + 0xf) -
               ((AdjustedVHeight + GMM_OUT_OF_MEMORY >> 2) + 0xf & 0xf);
      AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      VHeight = AdjustedVHeight + Status * 2;
      pRestrictions_local[4].MinHeight = 3;
      break;
    case 0x15c:
    case 0x15d:
    case 0x15e:
    case 0x160:
    case 0x161:
    case 0x162:
    case 0x163:
    case 0x180:
      if ((((pRestrictions_local->PitchAlignment == 0x15d) ||
           (pRestrictions_local->PitchAlignment == 0x15e)) ||
          (pRestrictions_local->PitchAlignment == 0x160)) ||
         ((pRestrictions_local->PitchAlignment == 0x161 ||
          (pRestrictions_local->PitchAlignment == 0x162)))) {
        Status = AdjustedVHeight + GMM_ERROR >> 1;
        VHeight = AdjustedVHeight + Status;
      }
      else {
        VHeight = AdjustedVHeight * 2;
        Status = AdjustedVHeight;
      }
      if ((((pRestrictions_local->PitchAlignment == 0x15d) ||
           (pRestrictions_local->PitchAlignment == 0x15e)) ||
          ((pRestrictions_local->PitchAlignment == 0x160 ||
           (((pRestrictions_local->PitchAlignment == 0x161 ||
             (pRestrictions_local->PitchAlignment == 0x162)) ||
            (pRestrictions_local->PitchAlignment == 0x163)))))) ||
         (pRestrictions_local->PitchAlignment == 0x180)) {
        YHeight = (YHeight + 1) - (YHeight + 1 & 1);
      }
      else {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffefffffffff;
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffdfffffffff;
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffbfffffffff;
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffff7ffffffff;
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffff7ffff | 0x80000;
      }
      bVar9 = true;
      pRestrictions_local[4].MinHeight = 2;
    }
    VHeight = (VHeight + 1) - (VHeight + 1 & 1);
    GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    uVar3._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar3._4_4_ = pRestrictions_local->MinPitch;
    if ((((uVar3 >> 0x10 & 1) != 0) &&
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) == 0)) &&
       (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) == 0 &&
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0)))) {
      uVar4._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar4._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar4 & 0xfffffffffffeffff);
      pRestrictions_local->MinPitch = (int)((uVar4 & 0xfffffffffffeffff) >> 0x20);
    }
    if (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x13 & 1) != 0) &&
       ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 4 & 1) == 0)) {
      if (_Height->LockPitchAlignment < 0x41) {
        local_a0 = 0x40;
      }
      else {
        local_a0 = _Height->LockPitchAlignment;
      }
      _Height->LockPitchAlignment = local_a0;
      if (_Height->MinPitch < 0x41) {
        local_a4 = 0x40;
      }
      else {
        local_a4 = _Height->MinPitch;
      }
      _Height->MinPitch = local_a4;
      if (_Height->PitchAlignment < 0x41) {
        local_a8 = 0x40;
      }
      else {
        local_a8 = _Height->PitchAlignment;
      }
      _Height->PitchAlignment = local_a8;
      if (_Height->RenderPitchAlignment < 0x41) {
        local_ac = 0x40;
      }
      else {
        local_ac = _Height->RenderPitchAlignment;
      }
      _Height->RenderPitchAlignment = local_ac;
    }
    if ((((pRestrictions_local->PitchAlignment == 0x14f) ||
         (pRestrictions_local->PitchAlignment == 0x150)) ||
        (pRestrictions_local->PitchAlignment == 0x15c)) ||
       ((pRestrictions_local->PitchAlignment == 0x174 ||
        (pRestrictions_local->PitchAlignment == 0x175)))) {
      sVar10 = 2;
      if (pRestrictions_local->PitchAlignment != 0x175) {
        sVar10 = 1;
      }
      _Height->LockPitchAlignment = _Height->LockPitchAlignment << sVar10;
      _Height->MinPitch = _Height->MinPitch << sVar10;
      _Height->PitchAlignment = _Height->PitchAlignment << sVar10;
      _Height->RenderPitchAlignment = _Height->RenderPitchAlignment << sVar10;
    }
    GStack_3c = Status;
    pWVar14 = Context::GetWaTable((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.
                                  pGmmLibContext);
    if ((((*(ulong *)&pWVar14->field_0x4 >> 0x2c & 1) != 0) &&
        (bVar11 = GmmIsYUVFormatLCUAligned(pRestrictions_local->PitchAlignment), bVar11)) &&
       (Status != GMM_SUCCESS)) {
      GStack_3c = (Status + 0x3f) - (Status + 0x3f & 0x3f);
      VHeight = (GStack_3c - Status) + VHeight;
    }
    if (pGVar13->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalSize != 0) {
      pGVar15 = Context::GetPlatformInfo
                          ((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext);
      uVar1 = pGVar15->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight;
      pGVar15 = Context::GetPlatformInfo
                          ((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext);
      uVar2 = pGVar15->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth;
      pRestrictions_local[4].field_0x2c = 1;
      if (bVar9) {
        local_b4 = (GStack_3c + (uVar1 - 1)) - (GStack_3c + (uVar1 - 1) & uVar1 - 1);
      }
      else {
        local_b4 = ((Status + uVar1 * 2) - (Status + (uVar1 - 1) & uVar1 - 1)) +
                   ((GStack_3c - GMM_INVALIDPARAM) - (GStack_3c + (uVar1 - 1) & uVar1 - 1));
      }
      VHeight = ((AdjustedVHeight + (uVar1 - 1)) - (AdjustedVHeight + (uVar1 - 1) & uVar1 - 1)) +
                local_b4;
      if ((pRestrictions_local->PitchAlignment == 0x152) ||
         (pRestrictions_local->PitchAlignment == 0x154)) {
        if (uVar2 == 0) {
          local_b8 = YHeight;
        }
        else {
          local_b8 = (YHeight + (uVar2 - 1)) / uVar2;
        }
        if ((local_b8 & 1) != 0) {
          YHeight = (local_b8 + 1) * uVar2;
        }
      }
      if (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0) ||
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0)) {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffffefffffff | 0x10000000;
      }
    }
    uVar5._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar5._4_4_ = pRestrictions_local->MinPitch;
    if ((((uVar5 >> 0x10 & 1) != 0) &&
        (uVar6._0_4_ = pRestrictions_local->LockPitchAlignment,
        uVar6._4_4_ = pRestrictions_local->MinPitch, (uVar6 >> 0x25 & 1) != 0)) &&
       ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) != 0)) {
      pGVar15 = Context::GetPlatformInfo
                          ((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext);
      uVar1 = pGVar15->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight;
      VHeight = ((AdjustedVHeight + uVar1 * 2) - (AdjustedVHeight + (uVar1 - 1) & uVar1 - 1)) +
                ((GStack_3c - GMM_INVALIDPARAM) - (GStack_3c + (uVar1 - 1) & uVar1 - 1));
    }
    if ((((int)(pGVar13->Platform).eRenderCoreFamily < 0xe) &&
        ((((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) != 0 ||
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0)) ||
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0)))) &&
       ((0x3fff < pRestrictions_local->MinAllocationSize *
                  (ulong)pRestrictions_local->RenderPitchAlignment >> 3 ||
        (((pRestrictions_local->PitchAlignment == 0x15d &&
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0)) &&
         (0x1f7f < pRestrictions_local->MinAllocationSize *
                   (ulong)pRestrictions_local->RenderPitchAlignment >> 3)))))) {
      uVar7._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar7._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar7 & 0xfffffffffffeffff);
      pRestrictions_local->MinPitch = (int)((uVar7 & 0xfffffffffffeffff) >> 0x20);
    }
    if ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x1c & 1) != 0) {
      GmmTextureCalc::RedescribeTexturePlanes
                ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local,&YHeight);
    }
    local_40 = GmmTextureCalc::FillTexPitchAndSize
                         ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local,
                          (ulong)YHeight,VHeight,_Height);
    if (local_40 == GMM_SUCCESS) {
      GmmTextureCalc::FillPlanarOffsetAddress
                ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    }
    if (1 < *(uint *)((long)&pRestrictions_local->MinWidth + 4)) {
      GVar8 = pRestrictions_local[2].MaxHeight;
      GVar16 = GVar8 * *(uint *)((long)&pRestrictions_local->MinWidth + 4);
      if (GVar16 - pGVar13->SurfaceMaxSize == 0 || (long)GVar16 < pGVar13->SurfaceMaxSize) {
        pRestrictions_local[3].Alignment = (int)GVar8;
        pRestrictions_local[3].PitchAlignment = (int)(GVar8 >> 0x20);
        pRestrictions_local[2].MaxHeight = GVar16;
      }
      else {
        local_40 = GMM_ERROR;
      }
    }
    this_local._4_4_ = local_40;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen10TextureCalc::FillTexPlanar(GMM_TEXTURE_INFO * pTexInfo,
                                                                  __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   WidthBytesPhysical, Height, YHeight, VHeight;
    uint32_t   AdjustedVHeight = 0;
    GMM_STATUS Status;
    bool       UVPacked = false;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(!pTexInfo->Flags.Info.TiledW);
    pTexInfo->TileMode = TILE_NONE;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    WidthBytesPhysical = GFX_ULONG_CAST(pTexInfo->BaseWidth) * pTexInfo->BitsPerPixel >> 3;
    Height = VHeight = 0;

    YHeight = pTexInfo->BaseHeight;

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1: // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420:  // Same as IMC3.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUUUUUU
                                          // UUUUUUUU
                                          // VVVVVVVV
                                          // VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height = YHeight + 2 * VHeight; // One VHeight for V and one for U.

                pTexInfo->OffsetInfo.Plane.NoOfPlanes = 3;

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //UUUUUUUU
                                               //VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height = YHeight + 2 * VHeight;

                pTexInfo->OffsetInfo.Plane.NoOfPlanes = 3;

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411:  // Similar to IMC3 but U/V are quarter width and full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UU
                                          // UU
                                          // UU
                                          // UU
                                          // VV
                                          // VV
                                          // VV
                                          // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height = YHeight + 2 * VHeight;

                pTexInfo->OffsetInfo.Plane.NoOfPlanes = 3;

                break;
            }
        case GMM_FORMAT_IMC2: // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            VHeight = GFX_CEIL_DIV(YHeight, 2);

            WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.

            Height = YHeight + VHeight;

            // With SURFACE_STATE.XOffset support, the U-V interface has
            // much lighter restrictions--which will be naturally met by
            // surface pitch restrictions (i.e. dividing an IMC2/4 pitch
            // by 2--to get the U/V interface--will always produce a safe
            // XOffset value).

            // Not technically UV packed but sizing works out the same
            // if the resource is std swizzled
            UVPacked                              = true;
            pTexInfo->OffsetInfo.Plane.NoOfPlanes = 2;

            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(YHeight, 2); // U/V plane half of Y
                Height  = YHeight + VHeight;
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
                Height  = YHeight + VHeight;
            }

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016) ||
               (pTexInfo->Format == GMM_FORMAT_P208) ||
               (pTexInfo->Format == GMM_FORMAT_P216))
            {
                WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.
            }
            else //if(pTexInfo->Format == GMM_FORMAT_NV11)
            {
                // Tiling not supported, since YPitch != UVPitch...
                pTexInfo->Flags.Info.TiledY  = 0;
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledYs = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.Linear  = 1;
            }

            UVPacked                              = true;
            pTexInfo->OffsetInfo.Plane.NoOfPlanes = 2;
            break;
        }
        case GMM_FORMAT_I420: // IYUV & I420: are identical to YV12 except,
        case GMM_FORMAT_IYUV: // U & V pl.s are reversed.
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, UVSize, YVSizeRShift;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = WidthBytesPhysical * YHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(WidthBytesPhysical, YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(YHeight, YSizeForUVPurposesDimensionalAlignment);

            UVSize = 2 * // <-- U + V
                     (YSizeForUVPurposes >> YVSizeRShift);

            Height = GFX_CEIL_DIV(YSize + UVSize, WidthBytesPhysical);

            // Tiling not supported, since YPitch != UVPitch...
            pTexInfo->Flags.Info.TiledY  = 0;
            pTexInfo->Flags.Info.TiledYf = 0;
            pTexInfo->Flags.Info.TiledYs = 0;
            pTexInfo->Flags.Info.TiledX  = 0;
            pTexInfo->Flags.Info.Linear  = 1;

            pTexInfo->OffsetInfo.Plane.NoOfPlanes = 1;
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unexpected format");
            return GMM_ERROR;
        }
    }

    // Align Height to even row to avoid hang if HW over-fetch
    Height = GFX_ALIGN(Height, __GMM_EVEN_ROW);

    SetTileMode(pTexInfo);

    // MMC is not supported for linear formats.
    if(pTexInfo->Flags.Gpu.MMC)
    {
        if(!(pTexInfo->Flags.Info.TiledY || pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }

    // Legacy Planar "Linear Video" Restrictions...
    if(pTexInfo->Flags.Info.Linear && !pTexInfo->Flags.Wa.NoLegacyPlanarLinearVideoRestrictions)
    {
        pRestrictions->LockPitchAlignment   = GFX_MAX(pRestrictions->LockPitchAlignment, GMM_BYTES(64));
        pRestrictions->MinPitch             = GFX_MAX(pRestrictions->MinPitch, GMM_BYTES(64));
        pRestrictions->PitchAlignment       = GFX_MAX(pRestrictions->PitchAlignment, GMM_BYTES(64));
        pRestrictions->RenderPitchAlignment = GFX_MAX(pRestrictions->RenderPitchAlignment, GMM_BYTES(64));
    }

    // Multiply overall pitch alignment for surfaces whose U/V planes have a
    // pitch down-scaled from that of Y--Since the U/V pitches must meet the
    // original restriction, the Y pitch must meet a scaled-up multiple.
    if((pTexInfo->Format == GMM_FORMAT_I420) ||
       (pTexInfo->Format == GMM_FORMAT_IYUV) ||
       (pTexInfo->Format == GMM_FORMAT_NV11) ||
       (pTexInfo->Format == GMM_FORMAT_YV12) ||
       (pTexInfo->Format == GMM_FORMAT_YVU9))
    {
        uint32_t LShift =
        (pTexInfo->Format != GMM_FORMAT_YVU9) ?
        1 : // UVPitch = 1/2 YPitch
        2;  // UVPitch = 1/4 YPitch

        pRestrictions->LockPitchAlignment <<= LShift;
        pRestrictions->MinPitch <<= LShift;
        pRestrictions->PitchAlignment <<= LShift;
        pRestrictions->RenderPitchAlignment <<= LShift;
    }

    AdjustedVHeight = VHeight;
    // In case of Planar surfaces, only the last Plane has to be aligned to 64 for LCU access
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU && GmmIsYUVFormatLCUAligned(pTexInfo->Format) && VHeight > 0)
    {
        AdjustedVHeight = GFX_ALIGN(VHeight, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
        Height += AdjustedVHeight - VHeight;
    }

    // For Tiled Planar surfaces, the planes must be tile-boundary aligned.
    // Actual alignment is handled in FillPlanarOffsetAddress, but height
    // and width must be adjusted for correct size calculation
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        uint32_t TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        pTexInfo->OffsetInfo.Plane.IsTileAlignedPlanes = true;

        //for separate U and V planes, use U plane unaligned and V plane aligned
        Height = GFX_ALIGN(YHeight, TileHeight) + (UVPacked ? GFX_ALIGN(AdjustedVHeight, TileHeight) :
                                                              (GFX_ALIGN(VHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight)));

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
            // If the U & V planes are side-by-side then the surface pitch must be
            // padded out so that U and V planes will being on a tile boundary.
            // This means that an odd Y plane width must be padded out
            // with an additional tile. Even widths do not need padding
            uint32_t TileCols = GFX_CEIL_DIV(WidthBytesPhysical, TileWidth);
            if(TileCols % 2)
            {
                WidthBytesPhysical = (TileCols + 1) * TileWidth;
            }
        }

        if(pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)
        {
            pTexInfo->Flags.Info.RedecribedPlanes = true;
        }
    }

    // Vary wide planar tiled planar formats do not support MMC pre gen11. All formats do not support
    //Special case LKF MMC compressed surfaces
    if(pTexInfo->Flags.Gpu.MMC &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       pTexInfo->Flags.Info.TiledY)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;

        Height = GFX_ALIGN(YHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight);
    }

    // Vary wide planar tiled planar formats do not support MMC pre gen11. All formats do not support
    // MMC above 16k bytes wide, while Yf NV12 does not support above 8k - 128 bytes.
    if((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) <= IGFX_GEN10_CORE) &&
       (pTexInfo->Flags.Info.TiledY || pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
    {
        if(((pTexInfo->BaseWidth * pTexInfo->BitsPerPixel / 8) >= GMM_KBYTE(16)) ||
           (pTexInfo->Format == GMM_FORMAT_NV12 && pTexInfo->Flags.Info.TiledYf &&
            (pTexInfo->BaseWidth * pTexInfo->BitsPerPixel / 8) >= (GMM_KBYTE(8) - 128)))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }
    
    if(pTexInfo->Flags.Info.RedecribedPlanes)
    {
        if(false == RedescribeTexturePlanes(pTexInfo, &WidthBytesPhysical))
        {
            __GMM_ASSERT(false);
        }
    }

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Height, pRestrictions)) == GMM_SUCCESS)
    {
        FillPlanarOffsetAddress(pTexInfo);
    }

    // Planar & hybrid 2D arrays supported in DX11.1+ spec but not HW. Memory layout
    // is defined by SW requirements; Y plane must be 4KB aligned.
    if(pTexInfo->ArraySize > 1)
    {
        GMM_GFX_SIZE_T ElementSizeBytes = pTexInfo->Size;
        int64_t        LargeSize;

        // Size should always be page aligned.
        __GMM_ASSERT((pTexInfo->Size % PAGE_SIZE) == 0);

        if((LargeSize = (int64_t)ElementSizeBytes * pTexInfo->ArraySize) <= pPlatform->SurfaceMaxSize)
        {
            pTexInfo->OffsetInfo.Plane.ArrayQPitch = ElementSizeBytes;
            pTexInfo->Size                         = LargeSize;
        }
        else
        {
            GMM_ASSERTDPF(0, "Surface too large!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return (Status);
}